

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Clara::CommonArgProperties<Catch::ConfigData>::~CommonArgProperties
          (CommonArgProperties<Catch::ConfigData> *this)

{
  BoundArgFunction<Catch::ConfigData> *in_RDI;
  
  std::__cxx11::string::~string((string *)(in_RDI + 9));
  std::__cxx11::string::~string((string *)(in_RDI + 5));
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  Detail::BoundArgFunction<Catch::ConfigData>::~BoundArgFunction(in_RDI);
  return;
}

Assistant:

CommonArgProperties() {}